

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O2

void de::createDirectory(char *path)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  runtime_error *this;
  FilePath parentPath;
  FilePath dirPath;
  string local_30;
  
  FilePath::FilePath(&parentPath,path);
  FilePath::normalize(&dirPath,&parentPath);
  std::__cxx11::string::~string((string *)&parentPath);
  FilePath::getDirName_abi_cxx11_(&local_30,&dirPath);
  std::__cxx11::string::string((string *)&parentPath,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = FilePath::exists(&dirPath);
  if (bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Destination exists already");
  }
  else {
    bVar1 = FilePath::exists(&parentPath);
    if (bVar1) {
      TVar2 = FilePath::getType(&parentPath);
      if (TVar2 == TYPE_DIRECTORY) {
        iVar3 = mkdir(path,0x1ff);
        if (iVar3 == 0) {
          std::__cxx11::string::~string((string *)&parentPath);
          std::__cxx11::string::~string((string *)&dirPath);
          return;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Failed to create directory");
      }
      else {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Parent is not directory");
      }
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Parent directory doesn\'t exist");
    }
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void createDirectory (const char* path)
{
	FilePath	dirPath		= FilePath::normalize(path);
	FilePath	parentPath	(dirPath.getDirName());

	if (dirPath.exists())
		throw std::runtime_error("Destination exists already");
	else if (!parentPath.exists())
		throw std::runtime_error("Parent directory doesn't exist");
	else if (parentPath.getType() != FilePath::TYPE_DIRECTORY)
		throw std::runtime_error("Parent is not directory");

	createDirectoryImpl(path);
}